

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Array.h
# Opt level: O1

void __thiscall asl::Array<asl::Socket>::free(Array<asl::Socket> *this,void *__ptr)

{
  int *piVar1;
  Socket *pSVar2;
  long lVar3;
  long *plVar4;
  long lVar5;
  long lVar6;
  
  pSVar2 = this->_a;
  lVar6 = (long)*(int *)&pSVar2[-2].super_SmartObject._p;
  if (lVar6 != 0) {
    lVar5 = 0;
    do {
      lVar3 = *(long *)((long)&(pSVar2->super_SmartObject)._p + lVar5);
      if (lVar3 != 0) {
        LOCK();
        piVar1 = (int *)(lVar3 + 8);
        *piVar1 = *piVar1 + -1;
        UNLOCK();
        if ((*piVar1 == 0) &&
           (plVar4 = *(long **)((long)&(pSVar2->super_SmartObject)._p + lVar5),
           plVar4 != (long *)0x0)) {
          (**(code **)(*plVar4 + 8))();
        }
      }
      lVar5 = lVar5 + 8;
    } while (lVar6 * 8 != lVar5);
  }
  ::free(this->_a + -2);
  this->_a = (Socket *)0x0;
  return;
}

Assistant:

void Array<T>::free()
{
	asl_destroy(_a, d().n);
	ASL_RC_FREE();
	::free( (char*)_a - sizeof(Data) );
	_a=0;
}